

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTCue_SetVariable(FACTCue *pCue,uint16_t nIndex,float nValue)

{
  FACTAudioEngine *pFVar1;
  FACTVariable *pFVar2;
  uint32_t uVar3;
  undefined6 in_register_00000032;
  float fVar4;
  
  uVar3 = 1;
  if ((int)CONCAT62(in_register_00000032,nIndex) != 0xffff && pCue != (FACTCue *)0x0) {
    FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
    pFVar1 = pCue->parentBank->parentEngine;
    pFVar2 = pFVar1->variables;
    fVar4 = pFVar2[nIndex].maxValue;
    if ((nValue <= fVar4) && (fVar4 = pFVar2[nIndex].minValue, fVar4 <= nValue)) {
      fVar4 = nValue;
    }
    pCue->variableValues[nIndex] = fVar4;
    FAudio_PlatformUnlockMutex(pFVar1->apiLock);
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

uint32_t FACTCue_SetVariable(
	FACTCue *pCue,
	uint16_t nIndex,
	float nValue
) {
	FACTVariable *var;
	if (pCue == NULL)
	{
		return 1;
	}

	if (nIndex == FACTINDEX_INVALID)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);

	var = &pCue->parentBank->parentEngine->variables[nIndex];
	FAudio_assert(var->accessibility & 0x01);
	FAudio_assert(!(var->accessibility & 0x02));
	FAudio_assert(var->accessibility & 0x04);
	pCue->variableValues[nIndex] = FAudio_clamp(
		nValue,
		var->minValue,
		var->maxValue
	);

	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return 0;
}